

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinParseYaml
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Interpreter *this_00;
  size_type sVar1;
  ulong uVar2;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  Tree *in_RSI;
  size_t in_RDI;
  undefined1 uVar3;
  bool filled;
  size_t i;
  Tree doc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  stringstream ss;
  json j;
  Tree tree;
  string value;
  nullptr_t in_stack_fffffffffffff9b8;
  Tree *in_stack_fffffffffffff9c0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffff9c8;
  size_type sVar4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffff9d0;
  allocator<char> *this_01;
  undefined7 in_stack_fffffffffffff9d8;
  undefined1 in_stack_fffffffffffff9df;
  Interpreter *in_stack_fffffffffffff9e0;
  allocator_type *in_stack_fffffffffffff9e8;
  allocator<char> *in_stack_fffffffffffff9f0;
  allocator<char> *__a;
  char *in_stack_fffffffffffff9f8;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffa38;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffa40;
  string *in_stack_fffffffffffffa68;
  string *in_stack_fffffffffffffa70;
  Interpreter *in_stack_fffffffffffffa78;
  size_type local_4b8;
  Tree *in_stack_fffffffffffffbb0;
  Interpreter *in_stack_fffffffffffffbb8;
  allocator<char> local_3a9;
  string local_3a8 [16];
  Value *in_stack_fffffffffffffc68;
  bool *in_stack_fffffffffffffc70;
  json *in_stack_fffffffffffffc78;
  Interpreter *in_stack_fffffffffffffc80;
  pointer in_stack_fffffffffffffca0;
  pointer in_stack_fffffffffffffca8;
  string *in_stack_fffffffffffffcb0;
  LocationRange *in_stack_fffffffffffffcb8;
  Interpreter *in_stack_fffffffffffffcc0;
  undefined1 local_1b8 [256];
  allocator<char> local_b8 [35];
  undefined1 local_95 [13];
  undefined8 local_88;
  allocator<char> local_51;
  string local_50 [32];
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_30;
  size_t local_18;
  undefined1 *local_10;
  Interpreter *local_8;
  
  local_30 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  local_95._1_4_ = 0x13;
  local_95._5_8_ =
       &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_95)->field_0x1;
  local_88 = 1;
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_95;
  __s = local_30;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x22ed5c);
  __l._M_len = (size_type)this_02;
  __l._M_array = (iterator)__s;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_stack_fffffffffffff9f0,__l,in_stack_fffffffffffff9e8);
  validateBuiltinArgs(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                       *)in_stack_fffffffffffffca8,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)in_stack_fffffffffffffca0);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
             *)in_stack_fffffffffffff9d0);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x22edc0);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  ::operator[](local_30,0);
  __a = local_b8;
  encode_utf8((UString *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
  treeFromString(in_stack_fffffffffffff9e0,
                 (string *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  local_18 = c4::yml::Tree::root_id(in_RSI);
  local_10 = local_1b8;
  this_00 = (Interpreter *)c4::yml::Tree::_p(in_RSI,in_RDI);
  uVar3 = ((undefined1  [64])this_00->heap & (undefined1  [64])0x28) == (undefined1  [64])0x28;
  local_8 = this_00;
  if ((bool)uVar3) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffcb0);
    c4::yml::operator<<((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        this_00,(Tree *)CONCAT17(uVar3,in_stack_fffffffffffff9d8));
    std::__cxx11::stringstream::str();
    this_01 = &local_3a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,__a);
    split(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    std::__cxx11::string::~string(local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc78);
    c4::yml::Tree::Tree(in_stack_fffffffffffff9c0);
    local_4b8 = 0;
    while( true ) {
      sVar4 = local_4b8;
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xfffffffffffffc98);
      if (sVar1 <= sVar4) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffc98,local_4b8);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xfffffffffffffc98,local_4b8);
        treeFromString(this_00,(string *)CONCAT17(uVar3,in_stack_fffffffffffff9d8));
        in_stack_fffffffffffff9c0 = (Tree *)&stack0xfffffffffffffb50;
        c4::yml::Tree::operator=(in_stack_fffffffffffff9c0,(Tree *)&stack0xfffffffffffffa48);
        c4::yml::Tree::~Tree((Tree *)0x22f023);
        (anonymous_namespace)::Interpreter::yamlTreeToJson_abi_cxx11_
                  (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::push_back(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_fffffffffffff9c0);
      }
      local_4b8 = local_4b8 + 1;
    }
    c4::yml::Tree::~Tree((Tree *)0x22f1f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffcb0);
  }
  else {
    (anonymous_namespace)::Interpreter::yamlTreeToJson_abi_cxx11_
              (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_fffffffffffff9c0);
  }
  otherJsonToHeap(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                  in_stack_fffffffffffffc68);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_fffffffffffff9c0);
  c4::yml::Tree::~Tree((Tree *)0x22f2b0);
  std::__cxx11::string::~string((string *)local_b8);
  return (AST *)0x0;
}

Assistant:

const AST *builtinParseYaml(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "parseYaml", args, {Value::STRING});

        std::string value = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);

        ryml::Tree tree = treeFromString(value);

        json j;
        if (tree.is_stream(tree.root_id())) {
            // Split into individual yaml documents
            std::stringstream ss;
            ss << tree;
            std::vector<std::string> v = split(ss.str(), "---\n");

            // Convert yaml to json and push onto json array
            ryml::Tree doc;
            for (std::size_t i = 0; i < v.size(); ++i) {
                if (!v[i].empty()) {
                    doc = treeFromString(v[i]);
                    j.push_back(yamlTreeToJson(doc));
                }
            }
        } else {
            j = yamlTreeToJson(tree);
        }

        bool filled;

        otherJsonToHeap(j, filled, scratch);

        return nullptr;
    }